

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locutil.cpp
# Opt level: O0

Locale * icu_63::LocaleUtility::initLocaleFromName(UnicodeString *id,Locale *result)

{
  UBool UVar1;
  int32_t iVar2;
  Locale local_180;
  int32_t local_a0;
  int32_t local_9c;
  int32_t i;
  int32_t prev;
  char buffer [128];
  Locale *result_local;
  UnicodeString *id_local;
  
  buffer._120_8_ = result;
  UVar1 = UnicodeString::isBogus(id);
  if ((UVar1 == '\0') && (iVar2 = UnicodeString::length(id), iVar2 < 0x80)) {
    local_9c = 0;
    while (local_a0 = UnicodeString::indexOf(id,L'@',local_9c), -1 < local_a0) {
      UnicodeString::extract
                (id,local_9c,local_a0 - local_9c,(char *)((long)&i + (long)local_9c),0x80 - local_9c
                 ,kInvariant);
      *(undefined1 *)((long)&i + (long)local_a0) = 0x40;
      local_9c = local_a0 + 1;
    }
    UnicodeString::extract
              (id,local_9c,0x7fffffff,(char *)((long)&i + (long)local_9c),0x80 - local_9c,kInvariant
              );
    Locale::createFromName(&local_180,(char *)&i);
    Locale::operator=((Locale *)buffer._120_8_,&local_180);
    Locale::~Locale(&local_180);
    return (Locale *)buffer._120_8_;
  }
  Locale::setToBogus((Locale *)buffer._120_8_);
  return (Locale *)buffer._120_8_;
}

Assistant:

Locale&
LocaleUtility::initLocaleFromName(const UnicodeString& id, Locale& result)
{
    enum { BUFLEN = 128 }; // larger than ever needed

    if (id.isBogus() || id.length() >= BUFLEN) {
        result.setToBogus();
    } else {
        /*
         * We need to convert from a UnicodeString to char * in order to
         * create a Locale.
         *
         * Problem: Locale ID strings may contain '@' which is a variant
         * character and cannot be handled by invariant-character conversion.
         *
         * Hack: Since ICU code can handle locale IDs with multiple encodings
         * of '@' (at least for EBCDIC; it's not known to be a problem for
         * ASCII-based systems),
         * we use regular invariant-character conversion for everything else
         * and manually convert U+0040 into a compiler-char-constant '@'.
         * While this compilation-time constant may not match the runtime
         * encoding of '@', it should be one of the encodings which ICU
         * recognizes.
         *
         * There should be only at most one '@' in a locale ID.
         */
        char buffer[BUFLEN];
        int32_t prev, i;
        prev = 0;
        for(;;) {
            i = id.indexOf((UChar)0x40, prev);
            if(i < 0) {
                // no @ between prev and the rest of the string
                id.extract(prev, INT32_MAX, buffer + prev, BUFLEN - prev, US_INV);
                break; // done
            } else {
                // normal invariant-character conversion for text between @s
                id.extract(prev, i - prev, buffer + prev, BUFLEN - prev, US_INV);
                // manually "convert" U+0040 at id[i] into '@' at buffer[i]
                buffer[i] = '@';
                prev = i + 1;
            }
        }
        result = Locale::createFromName(buffer);
    }
    return result;
}